

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int16_t iVar2;
  reference pvVar3;
  ostream *poVar4;
  int iVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arguments;
  vector<BoxNesting::Box,_std::allocator<BoxNesting::Box>_> local_88;
  HopcroftKarpAlgorithm boxNestingAlgorithm;
  
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::vector<char**,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&arguments,argv,
             argv + argc,(allocator_type *)&boxNestingAlgorithm);
  if ((ulong)((long)arguments.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)arguments.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
    BoxNesting::Parser::getBoxes(&local_88,(istream *)&std::cin);
    BoxNesting::HopcroftKarpAlgorithm::HopcroftKarpAlgorithm(&boxNestingAlgorithm,&local_88);
    std::vector<BoxNesting::Box,_std::allocator<BoxNesting::Box>_>::~vector(&local_88);
    iVar2 = BoxNesting::HopcroftKarpAlgorithm::runAlgorithm(&boxNestingAlgorithm);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
    std::endl<char,std::char_traits<char>>(poVar4);
    BoxNesting::HopcroftKarpAlgorithm::~HopcroftKarpAlgorithm(&boxNestingAlgorithm);
    iVar5 = 0;
  }
  else {
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at(&arguments,1);
    bVar1 = std::operator==(pvVar3,"--version");
    if (!bVar1) {
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at(&arguments,1);
      bVar1 = std::operator==(pvVar3,"-v");
      if (!bVar1) {
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::at(&arguments,1);
        bVar1 = std::operator==(pvVar3,"--help");
        if (!bVar1) {
          pvVar3 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::at(&arguments,1);
          bVar1 = std::operator==(pvVar3,"-h");
          if (!bVar1) {
            poVar4 = std::operator<<((ostream *)&std::cout,"unknown options: \"");
            pvVar3 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::at(&arguments,1);
            poVar4 = std::operator<<(poVar4,(string *)pvVar3);
            poVar4 = std::operator<<(poVar4,"\"");
            poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
            std::endl<char,std::char_traits<char>>(poVar4);
            pvVar3 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::at(&arguments,0);
            printHelp(pvVar3);
            iVar5 = 1;
            goto LAB_00104aac;
          }
        }
        iVar5 = 0;
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::at(&arguments,0);
        printHelp(pvVar3);
        goto LAB_00104aac;
      }
    }
    iVar5 = 0;
    printVersion();
  }
LAB_00104aac:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&arguments);
  return iVar5;
}

Assistant:

int main(int argc, char** argv)
{
	// Because ptr arithmatic is not allowed but we need it here
	// to access program arguments we exclude no lint here
	std::vector<std::string> arguments(argv, argv + argc); // NOLINT

	if (arguments.size() >= 2) {
		if (arguments.at(1) == "--version" || arguments.at(1) == "-v") {
			printVersion();
		} else if (arguments.at(1) == "--help" || arguments.at(1) == "-h") {
			printHelp(arguments.at(0));
		} else {
			std::cout << "unknown options: \"" << arguments.at(1) << "\"" << std::endl << std::endl;
			printHelp(arguments.at(0));
			return EXIT_FAILURE;
		}
		return EXIT_SUCCESS;
	}

	BoxNesting::HopcroftKarpAlgorithm boxNestingAlgorithm(BoxNesting::Parser::getBoxes(std::cin));

	std::cout << boxNestingAlgorithm.runAlgorithm() << std::endl;

	return EXIT_SUCCESS;
}